

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O3

ParquetKeys * duckdb::ParquetKeys::Get(ClientContext *context)

{
  _Hash_node_base *p_Var1;
  ObjectCache *this;
  type pPVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_90 [32];
  _Prime_rehash_policy local_70;
  undefined1 local_60 [16];
  string local_50;
  
  this = ObjectCache::GetObjectCache(context);
  p_Var1 = (_Hash_node_base *)(local_90 + 0x20);
  local_70._M_max_load_factor = 1.2002107e+30;
  local_70._4_4_ = 0x5f746575;
  local_70._M_next_resize._0_4_ = 0x7379656b;
  local_90._24_8_ = 0xc;
  local_70._M_next_resize._4_1_ = 0;
  local_90._16_8_ = p_Var1;
  ObjectCache::Get<duckdb::ParquetKeys>((ObjectCache *)local_90,(string *)this);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  if ((_Hash_node_base *)local_90._16_8_ != p_Var1) {
    operator_delete((void *)local_90._16_8_);
  }
  if ((element_type *)local_90._0_8_ == (element_type *)0x0) {
    local_50.field_2._M_allocated_capacity = 0x5f74657571726170;
    local_50.field_2._8_4_ = 0x7379656b;
    local_50._M_string_length = 0xc;
    local_50.field_2._M_local_buf[0xc] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_60._8_8_ = operator_new(0x50);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_019ae698;
    local_60._0_8_ = local_60._8_8_ + 0x10;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x30))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x30))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)&PTR__ParquetKeys_019ae628;
    *(_Atomic_word **)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x10))->_M_use_count =
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x40))->_M_use_count;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x20))->
    _vptr__Sp_counted_base = (_func_int **)0x1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x20))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x20))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x30))->_M_use_count =
         0x3f800000;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x40))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x40))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x40))->_M_weak_count = 0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_)->_M_use_count = 2;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    ObjectCache::Put(this,&local_50,(shared_ptr<duckdb::ObjectCacheEntry,_true> *)(local_90 + 0x30))
    ;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_70._M_max_load_factor = 1.2002107e+30;
  local_70._4_4_ = 0x5f746575;
  local_70._M_next_resize._0_4_ = 0x7379656b;
  local_90._24_8_ = 0xc;
  local_70._M_next_resize._4_1_ = 0;
  local_90._16_8_ = p_Var1;
  ObjectCache::Get<duckdb::ParquetKeys>((ObjectCache *)local_90,(string *)this);
  pPVar2 = shared_ptr<duckdb::ParquetKeys,_true>::operator*
                     ((shared_ptr<duckdb::ParquetKeys,_true> *)local_90);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  if ((_Hash_node_base *)local_90._16_8_ != p_Var1) {
    operator_delete((void *)local_90._16_8_);
  }
  return pPVar2;
}

Assistant:

ParquetKeys &ParquetKeys::Get(ClientContext &context) {
	auto &cache = ObjectCache::GetObjectCache(context);
	if (!cache.Get<ParquetKeys>(ParquetKeys::ObjectType())) {
		cache.Put(ParquetKeys::ObjectType(), make_shared_ptr<ParquetKeys>());
	}
	return *cache.Get<ParquetKeys>(ParquetKeys::ObjectType());
}